

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void tpl_model_update(TplParams *tpl_data,int mi_row,int mi_col,int frame_idx)

{
  long in_RDI;
  BLOCK_SIZE tpl_stats_block_size;
  int in_stack_000000cc;
  int in_stack_000000d0;
  BLOCK_SIZE in_stack_000000d7;
  int in_stack_000000d8;
  int in_stack_000000dc;
  TplParams *in_stack_000000e0;
  
  convert_length_to_bsize(4 << (*(byte *)(in_RDI + 4) & 0x1f));
  tpl_model_update_b(in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d7,
                     in_stack_000000d0,in_stack_000000cc);
  tpl_model_update_b(in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d7,
                     in_stack_000000d0,in_stack_000000cc);
  return;
}

Assistant:

static inline void tpl_model_update(TplParams *const tpl_data, int mi_row,
                                    int mi_col, int frame_idx) {
  const BLOCK_SIZE tpl_stats_block_size =
      convert_length_to_bsize(MI_SIZE << tpl_data->tpl_stats_block_mis_log2);
  tpl_model_update_b(tpl_data, mi_row, mi_col, tpl_stats_block_size, frame_idx,
                     0);
  tpl_model_update_b(tpl_data, mi_row, mi_col, tpl_stats_block_size, frame_idx,
                     1);
}